

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_mismatch.cpp
# Opt level: O2

int main(void)

{
  allocator_type local_5d;
  value_type local_5c;
  vector<int,_std::allocator<int>_> v;
  vector<int,_std::allocator<int>_> v3;
  vector<int,_std::allocator<int>_> v2;
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
       4;
  std::vector<int,_std::allocator<int>_>::vector
            (&v2,2,(value_type *)&v3,(allocator_type *)&local_5c);
  local_5c = 4;
  std::vector<int,_std::allocator<int>_>::vector(&v3,3,&local_5c,&local_5d);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&v,
             (const_iterator)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v3.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
  std::vector<int> v;
  std::vector<int> v2(2,4);
  std::vector<int> v3(3,4);

  v.insert(v.begin(), v2.begin(), v3.end());

}